

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

void __thiscall
spvtools::val::ValidationState_t::RegisterCapability(ValidationState_t *this,Capability cap)

{
  uint uVar1;
  bool bVar2;
  spv_result_t sVar3;
  Capability cap_00;
  long lVar4;
  ulong uVar5;
  Capability *value;
  spv_operand_desc desc;
  iterator __begin3;
  Capability local_74;
  spv_operand_desc local_70;
  pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> local_68;
  EnumSet<spv::Capability> local_48;
  
  local_74 = cap;
  bVar2 = EnumSet<spv::Capability>::contains(&this->module_capabilities_,cap);
  if (!bVar2) {
    EnumSet<spv::Capability>::insert(&local_68,&this->module_capabilities_,&local_74);
    sVar3 = AssemblyGrammar::lookupOperand
                      (&this->grammar_,SPV_OPERAND_TYPE_CAPABILITY,local_74,&local_70);
    if (sVar3 == SPV_SUCCESS) {
      uVar5 = (ulong)local_70->numCapabilities;
      value = local_70->capabilities;
      local_48.buckets_.
      super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.buckets_.
      super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.buckets_.
      super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48.size_ = 0;
      if (uVar5 != 0) {
        do {
          EnumSet<spv::Capability>::insert(&local_68,&local_48,value);
          value = value + 1;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      EnumSet<spv::Capability>::cbegin(&local_68.first,&local_48);
      lVar4 = (long)local_48.buckets_.
                    super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_48.buckets_.
                    super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      while (((local_68.first.set_ != &local_48 || (local_68.first.bucketOffset_ != 0)) ||
             (local_68.first.bucketIndex_ != lVar4 >> 4))) {
        cap_00 = EnumSet<spv::Capability>::Iterator::operator*(&local_68.first);
        RegisterCapability(this,cap_00);
        EnumSet<spv::Capability>::Iterator::operator++(&local_68.first);
      }
      if (local_48.buckets_.
          super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.buckets_.
                        super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.buckets_.
                              super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.buckets_.
                              super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((int)local_74 < 0x27) {
      if (local_74 - CapabilityFloat16Buffer < 2) {
        (this->features_).declare_float16_type = true;
      }
      else if (local_74 == CapabilityKernel) {
        (this->features_).group_ops_reduce_and_scans = true;
      }
      else if (local_74 == CapabilityInt16) {
        (this->features_).declare_int16_type = true;
      }
    }
    else {
      uVar1 = local_74 - CapabilityWorkgroupMemoryExplicitLayout8BitAccessKHR;
      if (uVar1 < 0x16) {
        if ((0xf2U >> (uVar1 & 0x1f) & 1) != 0) {
          (this->features_).declare_int16_type = true;
          (this->features_).declare_float16_type = true;
          (this->features_).free_fp_rounding_mode = true;
          return;
        }
        if ((0x380001U >> (uVar1 & 0x1f) & 1) != 0) {
          (this->features_).declare_int8_type = true;
          return;
        }
        if ((0x3000U >> (uVar1 & 0x1f) & 1) != 0) {
          (this->features_).variable_pointers = true;
          return;
        }
      }
      if (local_74 == CapabilityInt8) {
        (this->features_).use_int8_type = true;
        (this->features_).declare_int8_type = true;
      }
    }
  }
  return;
}

Assistant:

void ValidationState_t::RegisterCapability(spv::Capability cap) {
  // Avoid redundant work.  Otherwise the recursion could induce work
  // quadrdatic in the capability dependency depth. (Ok, not much, but
  // it's something.)
  if (module_capabilities_.contains(cap)) return;

  module_capabilities_.insert(cap);
  spv_operand_desc desc;
  if (SPV_SUCCESS == grammar_.lookupOperand(SPV_OPERAND_TYPE_CAPABILITY,
                                            uint32_t(cap), &desc)) {
    for (auto capability :
         CapabilitySet(desc->numCapabilities, desc->capabilities)) {
      RegisterCapability(capability);
    }
  }

  switch (cap) {
    case spv::Capability::Kernel:
      features_.group_ops_reduce_and_scans = true;
      break;
    case spv::Capability::Int8:
      features_.use_int8_type = true;
      features_.declare_int8_type = true;
      break;
    case spv::Capability::StorageBuffer8BitAccess:
    case spv::Capability::UniformAndStorageBuffer8BitAccess:
    case spv::Capability::StoragePushConstant8:
    case spv::Capability::WorkgroupMemoryExplicitLayout8BitAccessKHR:
      features_.declare_int8_type = true;
      break;
    case spv::Capability::Int16:
      features_.declare_int16_type = true;
      break;
    case spv::Capability::Float16:
    case spv::Capability::Float16Buffer:
      features_.declare_float16_type = true;
      break;
    case spv::Capability::StorageUniformBufferBlock16:
    case spv::Capability::StorageUniform16:
    case spv::Capability::StoragePushConstant16:
    case spv::Capability::StorageInputOutput16:
    case spv::Capability::WorkgroupMemoryExplicitLayout16BitAccessKHR:
      features_.declare_int16_type = true;
      features_.declare_float16_type = true;
      features_.free_fp_rounding_mode = true;
      break;
    case spv::Capability::VariablePointers:
    case spv::Capability::VariablePointersStorageBuffer:
      features_.variable_pointers = true;
      break;
    default:
      // TODO(dneto): For now don't validate SPV_NV_ray_tracing, which uses
      // capability spv::Capability::RayTracingNV.
      // spv::Capability::RayTracingProvisionalKHR would need the same
      // treatment. One of the differences going from SPV_KHR_ray_tracing from
      // provisional to final spec was the provisional spec uses Locations
      // for variables in certain storage classes, just like the
      // SPV_NV_ray_tracing extension.  So it mimics the NVIDIA extension.
      // The final SPV_KHR_ray_tracing uses a different capability token
      // number, so it doesn't fall into this case.
      break;
  }
}